

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Literal * __thiscall
wasm::TranslateToFuzzReader::makeLiteral
          (Literal *__return_storage_ptr__,TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  int8_t iVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  uchar uVar6;
  int16_t iVar7;
  ushort uVar8;
  short sVar9;
  short sVar10;
  unsigned_short uVar11;
  Index IVar12;
  int32_t iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  BasicType BVar17;
  int64_t init;
  long lVar18;
  long lVar19;
  unsigned_long uVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  double args_4;
  Literal local_638;
  Literal local_620;
  Literal local_608;
  Literal local_5f0;
  Literal local_5d8;
  undefined1 local_5c0 [8];
  Literal value_1;
  Literal local_590;
  Literal local_578;
  Literal local_560;
  Literal local_548;
  undefined1 local_530 [8];
  Literal value;
  int64_t small;
  Type local_508;
  Literal *local_500;
  array<wasm::Literal,_2UL> local_4f8;
  Type local_4c8;
  Type local_4c0;
  Type local_4b8;
  Type local_4b0;
  Literal *local_4a8;
  array<wasm::Literal,_4UL> local_4a0;
  Type local_440;
  Type local_438;
  Literal *local_430;
  array<wasm::Literal,_2UL> local_428;
  Type local_3f8;
  Type local_3f0;
  Type local_3e8;
  Type local_3e0;
  Literal *local_3d8;
  array<wasm::Literal,_4UL> local_3d0;
  Type local_370;
  Type local_368;
  Type local_360;
  Type local_358;
  Type local_350;
  Type local_348;
  Type local_340;
  Type local_338;
  Literal *local_330;
  array<wasm::Literal,_8UL> local_328;
  Type local_268;
  Type local_260;
  Type local_258;
  Type local_250;
  Type local_248;
  Type local_240;
  Type local_238;
  Type local_230;
  Type local_228;
  Type local_220;
  Type local_218;
  Type local_210;
  Type local_208;
  Type local_200;
  Type local_1f8 [3];
  Type local_1e0;
  Literal *local_1d8;
  array<wasm::Literal,_16UL> local_1d0;
  BasicType local_4c;
  TranslateToFuzzReader *local_48;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_4c = v128;
  local_48 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  bVar1 = Type::operator==((Type *)&this_local,&local_4c);
  if (bVar1) {
    IVar12 = upTo(this,6);
    switch(IVar12) {
    case 0:
      local_1d8 = local_1d0._M_elems;
      Type::Type(&local_1e0,i32);
      makeLiteral(local_1d0._M_elems,this,local_1e0);
      local_1d8 = local_1d0._M_elems + 1;
      Type::Type(local_1f8,i32);
      makeLiteral(local_1d0._M_elems + 1,this,local_1f8[0]);
      local_1d8 = local_1d0._M_elems + 2;
      Type::Type(&local_200,i32);
      makeLiteral(local_1d0._M_elems + 2,this,local_200);
      local_1d8 = local_1d0._M_elems + 3;
      Type::Type(&local_208,i32);
      makeLiteral(local_1d0._M_elems + 3,this,local_208);
      local_1d8 = local_1d0._M_elems + 4;
      Type::Type(&local_210,i32);
      makeLiteral(local_1d0._M_elems + 4,this,local_210);
      local_1d8 = local_1d0._M_elems + 5;
      Type::Type(&local_218,i32);
      makeLiteral(local_1d0._M_elems + 5,this,local_218);
      local_1d8 = local_1d0._M_elems + 6;
      Type::Type(&local_220,i32);
      makeLiteral(local_1d0._M_elems + 6,this,local_220);
      local_1d8 = local_1d0._M_elems + 7;
      Type::Type(&local_228,i32);
      makeLiteral(local_1d0._M_elems + 7,this,local_228);
      local_1d8 = local_1d0._M_elems + 8;
      Type::Type(&local_230,i32);
      makeLiteral(local_1d0._M_elems + 8,this,local_230);
      local_1d8 = local_1d0._M_elems + 9;
      Type::Type(&local_238,i32);
      makeLiteral(local_1d0._M_elems + 9,this,local_238);
      local_1d8 = local_1d0._M_elems + 10;
      Type::Type(&local_240,i32);
      makeLiteral(local_1d0._M_elems + 10,this,local_240);
      local_1d8 = local_1d0._M_elems + 0xb;
      Type::Type(&local_248,i32);
      makeLiteral(local_1d0._M_elems + 0xb,this,local_248);
      local_1d8 = local_1d0._M_elems + 0xc;
      Type::Type(&local_250,i32);
      makeLiteral(local_1d0._M_elems + 0xc,this,local_250);
      local_1d8 = local_1d0._M_elems + 0xd;
      Type::Type(&local_258,i32);
      makeLiteral(local_1d0._M_elems + 0xd,this,local_258);
      local_1d8 = local_1d0._M_elems + 0xe;
      Type::Type(&local_260,i32);
      makeLiteral(local_1d0._M_elems + 0xe,this,local_260);
      local_1d8 = local_1d0._M_elems + 0xf;
      Type::Type(&local_268,i32);
      makeLiteral(local_1d0._M_elems + 0xf,this,local_268);
      ::wasm::Literal::Literal(__return_storage_ptr__,(array *)&local_1d0);
      std::array<wasm::Literal,_16UL>::~array(&local_1d0);
      break;
    case 1:
      local_330 = local_328._M_elems;
      Type::Type(&local_338,i32);
      makeLiteral(local_328._M_elems,this,local_338);
      local_330 = local_328._M_elems + 1;
      Type::Type(&local_340,i32);
      makeLiteral(local_328._M_elems + 1,this,local_340);
      local_330 = local_328._M_elems + 2;
      Type::Type(&local_348,i32);
      makeLiteral(local_328._M_elems + 2,this,local_348);
      local_330 = local_328._M_elems + 3;
      Type::Type(&local_350,i32);
      makeLiteral(local_328._M_elems + 3,this,local_350);
      local_330 = local_328._M_elems + 4;
      Type::Type(&local_358,i32);
      makeLiteral(local_328._M_elems + 4,this,local_358);
      local_330 = local_328._M_elems + 5;
      Type::Type(&local_360,i32);
      makeLiteral(local_328._M_elems + 5,this,local_360);
      local_330 = local_328._M_elems + 6;
      Type::Type(&local_368,i32);
      makeLiteral(local_328._M_elems + 6,this,local_368);
      local_330 = local_328._M_elems + 7;
      Type::Type(&local_370,i32);
      makeLiteral(local_328._M_elems + 7,this,local_370);
      ::wasm::Literal::Literal(__return_storage_ptr__,(array *)&local_328);
      std::array<wasm::Literal,_8UL>::~array(&local_328);
      break;
    case 2:
      local_3d8 = local_3d0._M_elems;
      Type::Type(&local_3e0,i32);
      makeLiteral(local_3d0._M_elems,this,local_3e0);
      local_3d8 = local_3d0._M_elems + 1;
      Type::Type(&local_3e8,i32);
      makeLiteral(local_3d0._M_elems + 1,this,local_3e8);
      local_3d8 = local_3d0._M_elems + 2;
      Type::Type(&local_3f0,i32);
      makeLiteral(local_3d0._M_elems + 2,this,local_3f0);
      local_3d8 = local_3d0._M_elems + 3;
      Type::Type(&local_3f8,i32);
      makeLiteral(local_3d0._M_elems + 3,this,local_3f8);
      ::wasm::Literal::Literal(__return_storage_ptr__,(array *)&local_3d0);
      std::array<wasm::Literal,_4UL>::~array(&local_3d0);
      break;
    case 3:
      local_430 = local_428._M_elems;
      Type::Type(&local_438,i64);
      makeLiteral(local_428._M_elems,this,local_438);
      local_430 = local_428._M_elems + 1;
      Type::Type(&local_440,i64);
      makeLiteral(local_428._M_elems + 1,this,local_440);
      ::wasm::Literal::Literal(__return_storage_ptr__,(array *)&local_428);
      std::array<wasm::Literal,_2UL>::~array(&local_428);
      break;
    case 4:
      local_4a8 = local_4a0._M_elems;
      Type::Type(&local_4b0,f32);
      makeLiteral(local_4a0._M_elems,this,local_4b0);
      local_4a8 = local_4a0._M_elems + 1;
      Type::Type(&local_4b8,f32);
      makeLiteral(local_4a0._M_elems + 1,this,local_4b8);
      local_4a8 = local_4a0._M_elems + 2;
      Type::Type(&local_4c0,f32);
      makeLiteral(local_4a0._M_elems + 2,this,local_4c0);
      local_4a8 = local_4a0._M_elems + 3;
      Type::Type(&local_4c8,f32);
      makeLiteral(local_4a0._M_elems + 3,this,local_4c8);
      ::wasm::Literal::Literal(__return_storage_ptr__,(array *)&local_4a0);
      std::array<wasm::Literal,_4UL>::~array(&local_4a0);
      break;
    case 5:
      local_500 = local_4f8._M_elems;
      Type::Type(&local_508,f64);
      makeLiteral(local_4f8._M_elems,this,local_508);
      local_500 = local_4f8._M_elems + 1;
      Type::Type((Type *)&small,f64);
      makeLiteral(local_4f8._M_elems + 1,this,(Type)small);
      ::wasm::Literal::Literal(__return_storage_ptr__,(array *)&local_4f8);
      std::array<wasm::Literal,_2UL>::~array(&local_4f8);
      break;
    default:
      ::wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xc60);
    }
  }
  else {
    IVar12 = upTo(this,4);
    switch(IVar12) {
    case 0:
      BVar17 = Type::getBasic((Type *)&this_local);
      switch(BVar17) {
      case none:
      case unreachable:
      case v128:
        ::wasm::handle_unreachable
                  ("invalid type",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xc73);
      case i32:
        iVar13 = get32(this);
        wasm::Literal::Literal(__return_storage_ptr__,iVar13);
        break;
      case i64:
        init = get64(this);
        wasm::Literal::Literal(__return_storage_ptr__,init);
        break;
      case f32:
        fVar21 = getFloat(this);
        wasm::Literal::Literal(__return_storage_ptr__,fVar21);
        break;
      case f64:
        dVar23 = getDouble(this);
        wasm::Literal::Literal(__return_storage_ptr__,dVar23);
        break;
      default:
        goto switchD_0021a7ed_default;
      }
      break;
    case 1:
      IVar12 = upTo(this,6);
      switch(IVar12) {
      case 0:
        iVar2 = get(this);
        value.type.id = (uintptr_t)iVar2;
        break;
      case 1:
        bVar3 = get(this);
        value.type.id = (uintptr_t)bVar3;
        break;
      case 2:
        iVar7 = get16(this);
        value.type.id = (uintptr_t)iVar7;
        break;
      case 3:
        uVar8 = get16(this);
        value.type.id = (uintptr_t)uVar8;
        break;
      case 4:
        iVar13 = get32(this);
        value.type.id = (uintptr_t)iVar13;
        break;
      case 5:
        uVar16 = get32(this);
        value.type.id = (uintptr_t)uVar16;
        break;
      default:
        ::wasm::handle_unreachable
                  ("invalid value",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xc8e);
      }
      BVar17 = Type::getBasic((Type *)&this_local);
      switch(BVar17) {
      case none:
      case unreachable:
      case v128:
        ::wasm::handle_unreachable
                  ("unexpected type",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xc9c);
      case i32:
        wasm::Literal::Literal(__return_storage_ptr__,(int32_t)value.type.id);
        break;
      case i64:
        wasm::Literal::Literal(__return_storage_ptr__,value.type.id);
        break;
      case f32:
        wasm::Literal::Literal(__return_storage_ptr__,(float)(long)value.type.id);
        break;
      case f64:
        wasm::Literal::Literal(__return_storage_ptr__,(double)(long)value.type.id);
        break;
      default:
        goto switchD_0021a7ed_default;
      }
      break;
    case 2:
      wasm::Literal::Literal((Literal *)local_530);
      BVar17 = Type::getBasic((Type *)&this_local);
      switch(BVar17) {
      case none:
      case unreachable:
      case v128:
        ::wasm::handle_unreachable
                  ("unexpected type",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xcdc);
      case i32:
        cVar4 = std::numeric_limits<signed_char>::min();
        cVar5 = std::numeric_limits<signed_char>::max();
        sVar9 = std::numeric_limits<short>::min();
        sVar10 = std::numeric_limits<short>::max();
        iVar14 = std::numeric_limits<int>::min();
        iVar15 = std::numeric_limits<int>::max();
        uVar6 = std::numeric_limits<unsigned_char>::max();
        uVar11 = std::numeric_limits<unsigned_short>::max();
        uVar16 = std::numeric_limits<unsigned_int>::max();
        iVar14 = pick<int,signed_char,signed_char,short,short,int,int,unsigned_char,unsigned_short,unsigned_int>
                           (this,0,cVar4,cVar5,sVar9,sVar10,iVar14,iVar15,uVar6,uVar11,uVar16);
        wasm::Literal::Literal(&local_548,iVar14);
        ::wasm::Literal::operator=((Literal *)local_530,&local_548);
        ::wasm::Literal::~Literal(&local_548);
        break;
      case i64:
        cVar4 = std::numeric_limits<signed_char>::min();
        cVar5 = std::numeric_limits<signed_char>::max();
        sVar9 = std::numeric_limits<short>::min();
        sVar10 = std::numeric_limits<short>::max();
        iVar14 = std::numeric_limits<int>::min();
        iVar15 = std::numeric_limits<int>::max();
        lVar18 = std::numeric_limits<long>::min();
        lVar19 = std::numeric_limits<long>::max();
        uVar6 = std::numeric_limits<unsigned_char>::max();
        uVar11 = std::numeric_limits<unsigned_short>::max();
        uVar16 = std::numeric_limits<unsigned_int>::max();
        uVar20 = std::numeric_limits<unsigned_long>::max();
        lVar18 = pick<long,signed_char,signed_char,short,short,int,int,long,long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
                           (this,0,cVar4,cVar5,sVar9,sVar10,iVar14,iVar15,lVar18,lVar19,uVar6,uVar11
                            ,uVar16,uVar20);
        wasm::Literal::Literal(&local_560,lVar18);
        ::wasm::Literal::operator=((Literal *)local_530,&local_560);
        ::wasm::Literal::~Literal(&local_560);
        break;
      case f32:
        fVar21 = std::numeric_limits<float>::min();
        fVar22 = std::numeric_limits<float>::max();
        iVar14 = std::numeric_limits<int>::min();
        iVar15 = std::numeric_limits<int>::max();
        lVar18 = std::numeric_limits<long>::min();
        lVar19 = std::numeric_limits<long>::max();
        uVar16 = std::numeric_limits<unsigned_int>::max();
        uVar20 = std::numeric_limits<unsigned_long>::max();
        fVar21 = pick<float,float,float,float,int,int,long,long,unsigned_int,unsigned_long>
                           (this,0.0,-0.0,fVar21,fVar22,iVar14,iVar15,lVar18,lVar19,uVar16,uVar20);
        wasm::Literal::Literal(&local_578,fVar21);
        ::wasm::Literal::operator=((Literal *)local_530,&local_578);
        ::wasm::Literal::~Literal(&local_578);
        break;
      case f64:
        fVar21 = std::numeric_limits<float>::min();
        fVar22 = std::numeric_limits<float>::max();
        dVar23 = std::numeric_limits<double>::min();
        args_4 = std::numeric_limits<double>::max();
        iVar14 = std::numeric_limits<int>::min();
        iVar15 = std::numeric_limits<int>::max();
        lVar18 = std::numeric_limits<long>::min();
        lVar19 = std::numeric_limits<long>::max();
        uVar16 = std::numeric_limits<unsigned_int>::max();
        uVar20 = std::numeric_limits<unsigned_long>::max();
        dVar23 = pick<double,double,float,float,double,double,int,int,long,long,unsigned_int,unsigned_long>
                           (this,0.0,-0.0,fVar21,fVar22,dVar23,args_4,iVar14,iVar15,lVar18,lVar19,
                            uVar16,uVar20);
        wasm::Literal::Literal(&local_590,dVar23);
        ::wasm::Literal::operator=((Literal *)local_530,&local_590);
        ::wasm::Literal::~Literal(&local_590);
      }
      ::wasm::Literal::Literal((Literal *)&value_1.type,(Literal *)local_530);
      tweak(__return_storage_ptr__,this,(Literal *)&value_1.type);
      ::wasm::Literal::~Literal((Literal *)&value_1.type);
      ::wasm::Literal::~Literal((Literal *)local_530);
      break;
    case 3:
      wasm::Literal::Literal((Literal *)local_5c0);
      BVar17 = Type::getBasic((Type *)&this_local);
      switch(BVar17) {
      case none:
      case unreachable:
      case v128:
        ::wasm::handle_unreachable
                  ("unexpected type",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xcf3);
      case i32:
        IVar12 = upTo(this,0x20);
        wasm::Literal::Literal(&local_5d8,1 << ((byte)IVar12 & 0x1f));
        ::wasm::Literal::operator=((Literal *)local_5c0,&local_5d8);
        ::wasm::Literal::~Literal(&local_5d8);
        break;
      case i64:
        IVar12 = upTo(this,0x40);
        wasm::Literal::Literal(&local_5f0,1L << ((byte)IVar12 & 0x3f));
        ::wasm::Literal::operator=((Literal *)local_5c0,&local_5f0);
        ::wasm::Literal::~Literal(&local_5f0);
        break;
      case f32:
        IVar12 = upTo(this,0x40);
        wasm::Literal::Literal(&local_608,(float)(1L << ((byte)IVar12 & 0x3f)));
        ::wasm::Literal::operator=((Literal *)local_5c0,&local_608);
        ::wasm::Literal::~Literal(&local_608);
        break;
      case f64:
        IVar12 = upTo(this,0x40);
        wasm::Literal::Literal(&local_620,(double)(1L << ((byte)IVar12 & 0x3f)));
        ::wasm::Literal::operator=((Literal *)local_5c0,&local_620);
        ::wasm::Literal::~Literal(&local_620);
      }
      ::wasm::Literal::Literal(&local_638,(Literal *)local_5c0);
      tweak(__return_storage_ptr__,this,&local_638);
      ::wasm::Literal::~Literal(&local_638);
      ::wasm::Literal::~Literal((Literal *)local_5c0);
      break;
    default:
switchD_0021a7ed_default:
      ::wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xcf8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Literal TranslateToFuzzReader::makeLiteral(Type type) {
  if (type == Type::v128) {
    // generate each lane individually for random lane interpretation
    switch (upTo(6)) {
      case 0:
        return Literal(std::array<Literal, 16>{{makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32)}});
      case 1:
        return Literal(std::array<Literal, 8>{{makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32)}});
      case 2:
        return Literal(std::array<Literal, 4>{{makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32)}});
      case 3:
        return Literal(std::array<Literal, 2>{
          {makeLiteral(Type::i64), makeLiteral(Type::i64)}});
      case 4:
        return Literal(std::array<Literal, 4>{{makeLiteral(Type::f32),
                                               makeLiteral(Type::f32),
                                               makeLiteral(Type::f32),
                                               makeLiteral(Type::f32)}});
      case 5:
        return Literal(std::array<Literal, 2>{
          {makeLiteral(Type::f64), makeLiteral(Type::f64)}});
      default:
        WASM_UNREACHABLE("unexpected value");
    }
  }

  switch (upTo(4)) {
    case 0: {
      // totally random, entire range
      switch (type.getBasic()) {
        case Type::i32:
          return Literal(get32());
        case Type::i64:
          return Literal(get64());
        case Type::f32:
          return Literal(getFloat());
        case Type::f64:
          return Literal(getDouble());
        case Type::v128:
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("invalid type");
      }
      break;
    }
    case 1: {
      // small range
      int64_t small;
      switch (upTo(6)) {
        case 0:
          small = int8_t(get());
          break;
        case 1:
          small = uint8_t(get());
          break;
        case 2:
          small = int16_t(get16());
          break;
        case 3:
          small = uint16_t(get16());
          break;
        case 4:
          small = int32_t(get32());
          break;
        case 5:
          small = uint32_t(get32());
          break;
        default:
          WASM_UNREACHABLE("invalid value");
      }
      switch (type.getBasic()) {
        case Type::i32:
          return Literal(int32_t(small));
        case Type::i64:
          return Literal(int64_t(small));
        case Type::f32:
          return Literal(float(small));
        case Type::f64:
          return Literal(double(small));
        case Type::v128:
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      break;
    }
    case 2: {
      // special values
      Literal value;
      switch (type.getBasic()) {
        case Type::i32:
          value = Literal(pick<int32_t>(0,
                                        std::numeric_limits<int8_t>::min(),
                                        std::numeric_limits<int8_t>::max(),
                                        std::numeric_limits<int16_t>::min(),
                                        std::numeric_limits<int16_t>::max(),
                                        std::numeric_limits<int32_t>::min(),
                                        std::numeric_limits<int32_t>::max(),
                                        std::numeric_limits<uint8_t>::max(),
                                        std::numeric_limits<uint16_t>::max(),
                                        std::numeric_limits<uint32_t>::max()));
          break;
        case Type::i64:
          value = Literal(pick<int64_t>(0,
                                        std::numeric_limits<int8_t>::min(),
                                        std::numeric_limits<int8_t>::max(),
                                        std::numeric_limits<int16_t>::min(),
                                        std::numeric_limits<int16_t>::max(),
                                        std::numeric_limits<int32_t>::min(),
                                        std::numeric_limits<int32_t>::max(),
                                        std::numeric_limits<int64_t>::min(),
                                        std::numeric_limits<int64_t>::max(),
                                        std::numeric_limits<uint8_t>::max(),
                                        std::numeric_limits<uint16_t>::max(),
                                        std::numeric_limits<uint32_t>::max(),
                                        std::numeric_limits<uint64_t>::max()));
          break;
        case Type::f32:
          value = Literal(pick<float>(0.0f,
                                      -0.0f,
                                      std::numeric_limits<float>::min(),
                                      std::numeric_limits<float>::max(),
                                      std::numeric_limits<int32_t>::min(),
                                      std::numeric_limits<int32_t>::max(),
                                      std::numeric_limits<int64_t>::min(),
                                      std::numeric_limits<int64_t>::max(),
                                      std::numeric_limits<uint32_t>::max(),
                                      std::numeric_limits<uint64_t>::max()));
          break;
        case Type::f64:
          value = Literal(pick<double>(0.0,
                                       -0.0,
                                       std::numeric_limits<float>::min(),
                                       std::numeric_limits<float>::max(),
                                       std::numeric_limits<double>::min(),
                                       std::numeric_limits<double>::max(),
                                       std::numeric_limits<int32_t>::min(),
                                       std::numeric_limits<int32_t>::max(),
                                       std::numeric_limits<int64_t>::min(),
                                       std::numeric_limits<int64_t>::max(),
                                       std::numeric_limits<uint32_t>::max(),
                                       std::numeric_limits<uint64_t>::max()));
          break;
        case Type::v128:
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      return tweak(value);
    }
    case 3: {
      // powers of 2
      Literal value;
      switch (type.getBasic()) {
        case Type::i32:
          value = Literal(int32_t(1) << upTo(32));
          break;
        case Type::i64:
          value = Literal(int64_t(1) << upTo(64));
          break;
        case Type::f32:
          value = Literal(float(int64_t(1) << upTo(64)));
          break;
        case Type::f64:
          value = Literal(double(int64_t(1) << upTo(64)));
          break;
        case Type::v128:
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      return tweak(value);
    }
  }
  WASM_UNREACHABLE("invalid value");
}